

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::LoadModule(State *this,string *module_name)

{
  anon_union_8_9_8deb4486_for_Value_0 *paVar1;
  bool bVar2;
  string *in_RDI;
  Value VVar3;
  ModuleManager *unaff_retaddr;
  Value value;
  string *in_stack_000000c8;
  ModuleManager *in_stack_000000d0;
  anon_union_8_9_8deb4486_for_Value_0 local_20;
  ValueT local_18;
  string *module_name_00;
  
  module_name_00 = in_RDI;
  std::unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>::operator->
            ((unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_> *)0x16878c)
  ;
  VVar3 = ModuleManager::GetModuleClosure(unaff_retaddr,module_name_00);
  local_20 = VVar3.field_0;
  local_18 = VVar3.type_;
  bVar2 = Value::IsNil((Value *)&local_20);
  if (bVar2) {
    std::unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>::operator->
              ((unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_> *)
               0x1687cd);
    ModuleManager::LoadModule(in_stack_000000d0,in_stack_000000c8);
  }
  else {
    paVar1 = *(anon_union_8_9_8deb4486_for_Value_0 **)(in_RDI + 0x40);
    *(anon_union_8_9_8deb4486_for_Value_0 **)(in_RDI + 0x40) = paVar1 + 2;
    *paVar1 = local_20;
    *(ValueT *)(paVar1 + 1) = local_18;
  }
  return;
}

Assistant:

void State::LoadModule(const std::string &module_name)
    {
        auto value = module_manager_->GetModuleClosure(module_name);
        if (value.IsNil())
            module_manager_->LoadModule(module_name);
        else
            *stack_.top_++ = value;
    }